

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relations.cpp
# Opt level: O3

Relations * __thiscall dg::vr::Relations::invert(Relations *this)

{
  Type TVar1;
  _WordT _Var2;
  long lVar3;
  
  lVar3 = 0;
  _Var2 = 0;
  do {
    if (((this->bits).super__Base_bitset<1UL>._M_w >> ((ulong)*(Type *)((long)&all + lVar3) & 0x3f)
        & 1) != 0) {
      TVar1 = inverted(*(Type *)((long)&all + lVar3));
      _Var2 = _Var2 | 1L << ((ulong)TVar1 & 0x3f);
    }
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x30);
  (this->bits).super__Base_bitset<1UL>._M_w = _Var2;
  return this;
}

Assistant:

Relations &Relations::invert() {
    std::bitset<Relations::total> newBits;
    for (Type rel : Relations::all) {
        if (has(rel)) {
            newBits.set(inverted(rel));
        }
    }

    std::swap(bits, newBits);
    return *this;
}